

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O1

void Sbd_NtkPerformOne(Sbd_Man_t *p,int Pivot)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int nStrs;
  word Truth;
  Sbd_Str_t Strs [10];
  int local_254;
  word local_250;
  Sbd_Str_t local_248 [10];
  
  local_250 = 0;
  local_254 = 0;
  if (((p->pSto != (Sbd_Sto_t *)0x0) || (iVar1 = Sbd_ManMergeCuts(p,Pivot), iVar1 == 0)) &&
     (iVar1 = Sbd_ManWindow(p,Pivot), iVar1 != 0)) {
    p->nTried = p->nTried + 1;
    p->nUsed = p->nUsed + 1;
    iVar1 = Sbd_ManCheckConst(p,Pivot);
    if (iVar1 < 0) {
      if (((p->pPars->fFindDivs == 0) || (p->pPars->nLutNum < 1)) ||
         (iVar1 = Sbd_ManExplore2(p,Pivot,&local_250), iVar1 == 0)) {
        if ((p->pPars->nLutNum < 2) ||
           (iVar2 = Sbd_ManExplore3(p,Pivot,&local_254,local_248), iVar1 = local_254, iVar2 == 0)) {
          p->nUsed = p->nUsed + -1;
          return;
        }
      }
      else {
        local_248[0].fLut = 1;
        local_248[0].nVarIns = p->vDivSet->nSize;
        if (0 < (long)local_248[0].nVarIns) {
          lVar3 = 0;
          do {
            local_248[0].VarIns[lVar3] = (int)lVar3;
            lVar3 = lVar3 + 1;
          } while (local_248[0].nVarIns != lVar3);
        }
        local_248[0].Res = local_250;
        iVar1 = 1;
      }
      Sbd_ManImplement2(p,Pivot,iVar1,local_248);
    }
    else {
      if ((Pivot < 0) || (p->vMirrors->nSize <= Pivot)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      p->vMirrors->pArray[(uint)Pivot] = iVar1;
    }
  }
  return;
}

Assistant:

void Sbd_NtkPerformOne( Sbd_Man_t * p, int Pivot )
{
    Sbd_Str_t Strs[SBD_DIV_MAX]; word Truth = 0;
    int RetValue, nStrs = 0;
    if ( !p->pSto && Sbd_ManMergeCuts( p, Pivot ) )
        return;
    if ( !Sbd_ManWindow( p, Pivot ) )
        return;
    //if ( Vec_IntSize(p->vWinObjs) > 100 )
    //    printf( "Obj %d : Win = %d   TFO = %d.  Roots = %d.\n", Pivot, Vec_IntSize(p->vWinObjs), Vec_IntSize(p->vTfo), Vec_IntSize(p->vRoots) );
    p->nTried++;
    p->nUsed++;
    RetValue = Sbd_ManCheckConst( p, Pivot );
    if ( RetValue >= 0 )
    {
        Vec_IntWriteEntry( p->vMirrors, Pivot, RetValue );
        //if ( p->pPars->fVerbose ) printf( "Node %5d:  Detected constant %d.\n", Pivot, RetValue );
    }
    else if ( p->pPars->fFindDivs && p->pPars->nLutNum >= 1 && Sbd_ManExplore2( p, Pivot, &Truth ) )
    {
        int i;
        Strs->fLut = 1;
        Strs->nVarIns = Vec_IntSize( p->vDivSet );
        for ( i = 0; i < Strs->nVarIns; i++ )
            Strs->VarIns[i] = i;
        Strs->Res = Truth;
        Sbd_ManImplement2( p, Pivot, 1, Strs );
        //if ( p->pPars->fVerbose ) printf( "Node %5d:  Detected LUT%d\n", Pivot, p->pPars->nLutSize );
    }
    else if ( p->pPars->nLutNum >= 2 && Sbd_ManExplore3( p, Pivot, &nStrs, Strs ) )
    {
        Sbd_ManImplement2( p, Pivot, nStrs, Strs );
        if ( !p->pPars->fVerbose ) 
            return;
        //if ( Vec_IntSize(p->vDivSet) <= 4 )
        //    printf( "Node %5d:  Detected %d\n", Pivot, p->pPars->nLutSize );
        //else if ( Vec_IntSize(p->vDivSet) <= 6 || (Vec_IntSize(p->vDivSet) == 7 && nStrs == 2) )
        //    printf( "Node %5d:  Detected %d%d\n", Pivot, p->pPars->nLutSize, p->pPars->nLutSize );
        //else 
        //    printf( "Node %5d:  Detected %d%d%d\n", Pivot, p->pPars->nLutSize, p->pPars->nLutSize, p->pPars->nLutSize );
    }
    else
        p->nUsed--;
}